

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::serialize<float>
          (options_serializer_boost_po *this,
          typed_option<std::vector<float,_std::allocator<float>_>_> *typed_option)

{
  vector<float,_std::allocator<float>_> *__x;
  undefined1 *puVar1;
  iterator __begin0;
  pointer pfVar2;
  vector<float,_std::allocator<float>_> vec;
  vector<float,_std::allocator<float>_> local_48;
  
  __x = (typed_option->m_value).
        super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__x != (vector<float,_std::allocator<float>_> *)0x0) {
    std::vector<float,_std::allocator<float>_>::vector(&local_48,__x);
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      puVar1 = &this->field_0x18;
      pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," --",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(typed_option->super_base_option).m_name._M_dataplus._M_p,
                   (typed_option->super_base_option).m_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
        std::ostream::_M_insert<double>((double)*pfVar2);
        pfVar2 = pfVar2 + 1;
      } while (pfVar2 != local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>> typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }